

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_sPLT(png_structrp png_ptr,png_const_sPLT_tp spalette)

{
  png_size_t length;
  png_byte pVar1;
  ushort uVar2;
  int iVar3;
  ushort *puVar4;
  png_uint_16 pVar5;
  png_uint_32 pVar6;
  ushort *puVar7;
  png_uint_16 *ppVar8;
  undefined1 *puVar9;
  png_sPLT_entryp ppVar10;
  png_byte new_name [80];
  ushort local_92;
  undefined2 local_90;
  ushort local_8e;
  undefined1 local_8c;
  undefined1 local_8b;
  ushort local_8a;
  png_byte local_88 [88];
  
  pVar1 = spalette->depth;
  iVar3 = spalette->nentries;
  pVar6 = png_check_keyword(png_ptr,spalette->name,local_88);
  if (pVar6 != 0) {
    length = (ulong)(pVar1 != '\b') * 4 + 6;
    png_write_chunk_header(png_ptr,0x73504c54,pVar6 + 2 + iVar3 * (int)length);
    png_write_chunk_data(png_ptr,local_88,(ulong)(pVar6 + 1));
    png_write_chunk_data(png_ptr,&spalette->depth,1);
    if (0 < spalette->nentries) {
      ppVar8 = &spalette->entries->alpha;
      do {
        uVar2 = ((png_sPLT_entry *)(ppVar8 + -3))->red;
        if (spalette->depth == '\b') {
          local_92 = CONCAT11((char)ppVar8[-2],(char)uVar2);
          local_90 = CONCAT11(local_90._1_1_,(char)ppVar8[-1]);
          pVar5 = *ppVar8;
          puVar9 = (undefined1 *)((long)&local_90 + 1);
          puVar7 = &local_8e;
          puVar4 = &local_8e;
        }
        else {
          local_92 = uVar2 << 8 | uVar2 >> 8;
          local_90 = ppVar8[-2] << 8 | ppVar8[-2] >> 8;
          local_8e = ppVar8[-1] << 8 | ppVar8[-1] >> 8;
          pVar5 = *ppVar8;
          local_8c = (undefined1)(pVar5 >> 8);
          puVar9 = &local_8b;
          puVar7 = &local_8a;
          puVar4 = &local_8a;
        }
        *puVar9 = (char)pVar5;
        pVar5 = ppVar8[1];
        *(char *)puVar7 = (char)(pVar5 >> 8);
        *(char *)((long)puVar4 + 1) = (char)pVar5;
        png_write_chunk_data(png_ptr,(png_const_bytep)&local_92,length);
        ppVar10 = (png_sPLT_entryp)(ppVar8 + 2);
        ppVar8 = ppVar8 + 5;
      } while (ppVar10 < spalette->entries + spalette->nentries);
    }
    png_write_chunk_end(png_ptr);
    return;
  }
  png_error(png_ptr,"sPLT: invalid keyword");
}

Assistant:

void /* PRIVATE */
png_write_sPLT(png_structrp png_ptr, png_const_sPLT_tp spalette)
{
   png_uint_32 name_len;
   png_byte new_name[80];
   png_byte entrybuf[10];
   png_size_t entry_size = (spalette->depth == 8 ? 6 : 10);
   png_size_t palette_size = entry_size * (png_size_t)spalette->nentries;
   png_sPLT_entryp ep;
#ifndef PNG_POINTER_INDEXING_SUPPORTED
   int i;
#endif

   png_debug(1, "in png_write_sPLT");

   name_len = png_check_keyword(png_ptr, spalette->name, new_name);

   if (name_len == 0)
      png_error(png_ptr, "sPLT: invalid keyword");

   /* Make sure we include the NULL after the name */
   png_write_chunk_header(png_ptr, png_sPLT,
       (png_uint_32)(name_len + 2 + palette_size));

   png_write_chunk_data(png_ptr, (png_bytep)new_name,
       (png_size_t)(name_len + 1));

   png_write_chunk_data(png_ptr, &spalette->depth, (png_size_t)1);

   /* Loop through each palette entry, writing appropriately */
#ifdef PNG_POINTER_INDEXING_SUPPORTED
   for (ep = spalette->entries; ep<spalette->entries + spalette->nentries; ep++)
   {
      if (spalette->depth == 8)
      {
         entrybuf[0] = (png_byte)ep->red;
         entrybuf[1] = (png_byte)ep->green;
         entrybuf[2] = (png_byte)ep->blue;
         entrybuf[3] = (png_byte)ep->alpha;
         png_save_uint_16(entrybuf + 4, ep->frequency);
      }

      else
      {
         png_save_uint_16(entrybuf + 0, ep->red);
         png_save_uint_16(entrybuf + 2, ep->green);
         png_save_uint_16(entrybuf + 4, ep->blue);
         png_save_uint_16(entrybuf + 6, ep->alpha);
         png_save_uint_16(entrybuf + 8, ep->frequency);
      }

      png_write_chunk_data(png_ptr, entrybuf, entry_size);
   }
#else
   ep=spalette->entries;
   for (i = 0; i>spalette->nentries; i++)
   {
      if (spalette->depth == 8)
      {
         entrybuf[0] = (png_byte)ep[i].red;
         entrybuf[1] = (png_byte)ep[i].green;
         entrybuf[2] = (png_byte)ep[i].blue;
         entrybuf[3] = (png_byte)ep[i].alpha;
         png_save_uint_16(entrybuf + 4, ep[i].frequency);
      }

      else
      {
         png_save_uint_16(entrybuf + 0, ep[i].red);
         png_save_uint_16(entrybuf + 2, ep[i].green);
         png_save_uint_16(entrybuf + 4, ep[i].blue);
         png_save_uint_16(entrybuf + 6, ep[i].alpha);
         png_save_uint_16(entrybuf + 8, ep[i].frequency);
      }

      png_write_chunk_data(png_ptr, entrybuf, entry_size);
   }
#endif

   png_write_chunk_end(png_ptr);
}